

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDfs.c
# Opt level: O2

void Abc_AigDfs_rec(Abc_Obj_t *pNode,Vec_Ptr_t *vNodes)

{
  int iVar1;
  uint uVar2;
  long lVar3;
  Abc_Obj_t *pNode_00;
  
  iVar1 = Abc_NodeIsTravIdCurrent(pNode);
  if (iVar1 == 0) {
    Abc_NodeSetTravIdCurrent(pNode);
    uVar2 = *(uint *)&pNode->field_0x14 & 0xf;
    if (((uVar2 != 2) && (uVar2 != 5)) && (iVar1 = Abc_AigNodeIsConst(pNode), iVar1 == 0)) {
      if ((*(uint *)&pNode->field_0x14 & 0xf) != 7) {
        __assert_fail("Abc_ObjIsNode( pNode )",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcDfs.c"
                      ,0x496,"void Abc_AigDfs_rec(Abc_Obj_t *, Vec_Ptr_t *)");
      }
      for (lVar3 = 0; lVar3 < (pNode->vFanins).nSize; lVar3 = lVar3 + 1) {
        Abc_AigDfs_rec((Abc_Obj_t *)pNode->pNtk->vObjs->pArray[(pNode->vFanins).pArray[lVar3]],
                       vNodes);
      }
      iVar1 = Abc_AigNodeIsChoice(pNode);
      pNode_00 = pNode;
      if (iVar1 != 0) {
        while (pNode_00 = (Abc_Obj_t *)(pNode_00->field_5).pData, pNode_00 != (Abc_Obj_t *)0x0) {
          Abc_AigDfs_rec(pNode_00,vNodes);
        }
      }
      Vec_PtrPush(vNodes,pNode);
      return;
    }
  }
  return;
}

Assistant:

void Abc_AigDfs_rec( Abc_Obj_t * pNode, Vec_Ptr_t * vNodes )
{
    Abc_Obj_t * pFanin;
    int i;
    // if this node is already visited, skip
    if ( Abc_NodeIsTravIdCurrent( pNode ) )
        return;
    // mark the node as visited
    Abc_NodeSetTravIdCurrent( pNode );
    // skip the PI
    if ( Abc_ObjIsCi(pNode) || Abc_AigNodeIsConst(pNode) )
        return;
    assert( Abc_ObjIsNode( pNode ) );
    // visit the transitive fanin of the node
    Abc_ObjForEachFanin( pNode, pFanin, i )
        Abc_AigDfs_rec( pFanin, vNodes );
    // visit the equivalent nodes
    if ( Abc_AigNodeIsChoice( pNode ) )
        for ( pFanin = (Abc_Obj_t *)pNode->pData; pFanin; pFanin = (Abc_Obj_t *)pFanin->pData )
            Abc_AigDfs_rec( pFanin, vNodes );
    // add the node after the fanins have been added
    Vec_PtrPush( vNodes, pNode );
}